

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::validateKTXorientation(ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint32_t *args_1;
  int iVar1;
  bool bVar2;
  string_view value;
  char local_3a [2];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  ulong local_28;
  
  this->foundKTXorientation = true;
  if (size == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = data[size - 1] == '\0';
  }
  if (bVar2 == false) {
    error<>(this,&Metadata::KTXorientationMissingNull);
  }
  local_38._M_len = (size_t)(size - bVar2);
  args_1 = &this->dimensionCount;
  local_38._M_str = (char *)data;
  if (size - bVar2 != this->dimensionCount) {
    local_28 = local_38._M_len;
    error<unsigned_long,unsigned_int&>
              (this,&Metadata::KTXorientationIncorrectDimension,&local_28,args_1);
  }
  if ((((local_38._M_len != 0) && (*args_1 != 0)) && (*local_38._M_str != 'l')) &&
     (*local_38._M_str != 'r')) {
    local_28 = local_28 & 0xffffffff00000000;
    local_3a[1] = 0x72;
    local_3a[0] = 'l';
    error<int,char_const&,char,char>
              (this,&Metadata::KTXorientationInvalidValue,(int *)&local_28,local_38._M_str,
               local_3a + 1,local_3a);
  }
  if (((1 < local_38._M_len) && (1 < *args_1)) &&
     ((local_38._M_str[1] != 'd' && (local_38._M_str[1] != 'u')))) {
    local_28 = CONCAT44(local_28._4_4_,1);
    local_3a[1] = 100;
    local_3a[0] = 'u';
    error<int,char_const&,char,char>
              (this,&Metadata::KTXorientationInvalidValue,(int *)&local_28,local_38._M_str + 1,
               local_3a + 1,local_3a);
  }
  if (((2 < local_38._M_len) && (2 < *args_1)) &&
     ((local_38._M_str[2] != 'i' && (local_38._M_str[2] != 'o')))) {
    local_28 = CONCAT44(local_28._4_4_,2);
    local_3a[1] = 0x6f;
    local_3a[0] = 'i';
    error<int,char_const&,char,char>
              (this,&Metadata::KTXorientationInvalidValue,(int *)&local_28,local_38._M_str + 2,
               local_3a + 1,local_3a);
  }
  if (this->checkGLTFBasisU == true) {
    if ((local_38._M_len == 2) && (iVar1 = bcmp(local_38._M_str,"rd",2), iVar1 == 0)) {
      return;
    }
    error<std::basic_string_view<char,std::char_traits<char>>const&>
              (this,&Metadata::KTXorientationInvalidGLTFBU,&local_38);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXorientation(const uint8_t* data, uint32_t size) {
    foundKTXorientation = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXorientationMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);

    if (value.size() != dimensionCount)
        error(Metadata::KTXorientationIncorrectDimension, value.size(), dimensionCount);

    if (value.size() > 0 && dimensionCount > 0 && value[0] != 'r' && value[0] != 'l')
        error(Metadata::KTXorientationInvalidValue, 0, value[0], 'r', 'l');

    if (value.size() > 1 && dimensionCount > 1 && value[1] != 'd' && value[1] != 'u')
        error(Metadata::KTXorientationInvalidValue, 1, value[1], 'd', 'u');

    if (value.size() > 2 && dimensionCount > 2 && value[2] != 'o' && value[2] != 'i')
        error(Metadata::KTXorientationInvalidValue, 2, value[2], 'o', 'i');

    if (checkGLTFBasisU && value != "rd")
        error(Metadata::KTXorientationInvalidGLTFBU, value);
}